

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pMVar7;
  void *pvVar8;
  void *pvVar9;
  Mat *this_00;
  pointer pvVar10;
  uint uVar11;
  float *pfVar12;
  pointer pfVar13;
  long lVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  size_type sVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  size_type __new_size;
  void *pvVar23;
  int j;
  long lVar24;
  float *pfVar25;
  long lVar26;
  int i;
  size_type sVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  int local_1bc;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  long local_168;
  vector<int,_std::allocator<int>_> picked;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  Mat bboxes;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar20 = this->num_class;
  if (iVar20 == -0xe9) {
    uVar11 = pMVar7[2].h;
    local_168 = (long)(int)uVar11;
  }
  else {
    local_168 = 1;
    uVar11 = pMVar7[2].w / 4;
  }
  piVar15 = &this->num_class;
  if (iVar20 == -0xe9) {
    piVar15 = &pMVar7[1].h;
  }
  __new_size = (size_type)*piVar15;
  bboxes.elemsize._0_4_ = 0;
  bboxes.elemsize._4_4_ = 0;
  bboxes.packing = 0;
  bboxes.data = (void *)0x0;
  bboxes.refcount._0_4_ = 0;
  bboxes.refcount._4_4_ = 0;
  bboxes.allocator = (Allocator *)0x0;
  bboxes.dims = 0;
  bboxes.w = 0;
  bboxes.h = 0;
  bboxes.c = 0;
  bboxes.cstep = 0;
  Mat::create(&bboxes,4,uVar11,4,opt->workspace_allocator);
  iVar17 = -100;
  if ((bboxes.data != (void *)0x0) && ((long)bboxes.c * bboxes.cstep != 0)) {
    uVar18 = 0;
    pvVar8 = pMVar7[2].data;
    if (iVar20 == -0xe9) {
      pvVar23 = (void *)0x0;
    }
    else {
      pvVar23 = (void *)((long)pMVar7[2].w * pMVar7[2].elemsize + (long)pvVar8);
    }
    pvVar9 = pMVar7->data;
    lVar24 = (long)bboxes.w;
    uVar21 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar21 = uVar18;
    }
    lVar26 = CONCAT44(bboxes.elemsize._4_4_,(undefined4)bboxes.elemsize);
    pfVar25 = (float *)bboxes.data;
    for (; uVar21 * 0x10 != uVar18; uVar18 = uVar18 + 0x10) {
      pfVar12 = (float *)((long)pvVar23 + uVar18);
      if (pvVar23 == (void *)0x0) {
        pfVar12 = this->variances;
      }
      uVar3 = *(undefined8 *)pfVar12;
      uVar4 = *(undefined8 *)(pfVar12 + 2);
      uVar5 = *(undefined8 *)((long)pvVar9 + uVar18);
      uVar6 = *(undefined8 *)((long)pvVar9 + uVar18 + 8);
      fVar28 = expf((float)((ulong)uVar6 >> 0x20) * (float)((ulong)uVar4 >> 0x20));
      fVar29 = expf((float)uVar6 * (float)uVar4);
      pfVar12 = (float *)((long)pvVar8 + uVar18);
      fVar32 = pfVar12[2] - *pfVar12;
      fVar33 = pfVar12[3] - pfVar12[1];
      fVar30 = (*pfVar12 + pfVar12[2]) * 0.5 + fVar32 * (float)uVar5 * (float)uVar3;
      fVar31 = (pfVar12[1] + pfVar12[3]) * 0.5 +
               fVar33 * (float)((ulong)uVar5 >> 0x20) * (float)((ulong)uVar3 >> 0x20);
      fVar29 = fVar29 * fVar32 * 0.5;
      fVar28 = fVar28 * fVar33 * 0.5;
      *pfVar25 = fVar30 - fVar29;
      pfVar25[1] = fVar31 - fVar28;
      pfVar25[2] = fVar30 + fVar29;
      pfVar25[3] = fVar31 + fVar28;
      pfVar25 = (float *)((long)pfVar25 + lVar24 * lVar26);
    }
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&all_class_bbox_rects,__new_size);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_class_bbox_scores,__new_size);
    sVar19 = 1;
    sVar27 = __new_size;
    if (iVar20 == -0xe9) {
      sVar27 = sVar19;
    }
    lVar24 = local_168 * 4;
    while( true ) {
      if ((long)__new_size <= (long)sVar19) break;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar26 = lVar24;
      for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
        fVar28 = *(float *)((long)pMVar7[1].data + lVar26);
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,fVar28);
        if (this->confidence_threshold <= fVar28 && fVar28 != this->confidence_threshold) {
          lVar14 = (long)bboxes.w * uVar18 *
                   CONCAT44(bboxes.elemsize._4_4_,(undefined4)bboxes.elemsize);
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(*(undefined4 *)((long)bboxes.data + lVar14 + 4),
                                 *(undefined4 *)((long)bboxes.data + lVar14));
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(*(undefined4 *)((long)bboxes.data + lVar14 + 0xc),
                                 *(undefined4 *)((long)bboxes.data + lVar14 + 8));
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(bbox_rects.
                                 super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (int)sVar19);
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                     (value_type *)&bbox_rects);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&class_bbox_scores,(value_type_conflict1 *)&picked);
        }
        lVar26 = lVar26 + sVar27 * 4;
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                 &class_bbox_scores);
      if (this->nms_top_k <
          (int)(((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x14)) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                   (long)this->nms_top_k);
        std::vector<float,_std::allocator<float>_>::resize(&class_bbox_scores,(long)this->nms_top_k)
        ;
      }
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      fVar28 = this->nms_threshold;
      uVar18 = ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x14;
      iVar20 = (int)uVar18;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,(long)iVar20,
                 (allocator_type *)&local_1bc);
      uVar16 = 0;
      if (0 < iVar20) {
        uVar16 = uVar18 & 0xffffffff;
      }
      pfVar13 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 2;
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[uVar18] =
             ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) -
             (float)((ulong)*(undefined8 *)(pfVar13 + -2) >> 0x20)) *
             ((float)*(undefined8 *)pfVar13 - (float)*(undefined8 *)(pfVar13 + -2));
        pfVar13 = pfVar13 + 5;
      }
      for (local_1bc = 0; local_1bc < iVar20; local_1bc = local_1bc + 1) {
        pfVar25 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)local_1bc * 5;
        uVar16 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        uVar18 = uVar16 & 0xffffffff;
        if ((int)uVar16 < 1) {
          uVar18 = 0;
        }
        uVar16 = 1;
        for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
          lVar26 = (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar22];
          fVar29 = *pfVar25;
          fVar30 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar26 * 5 + 2];
          fVar31 = 0.0;
          if (fVar29 <= fVar30) {
            pfVar12 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar26 * 5;
            fVar32 = pfVar25[2];
            fVar33 = *pfVar12;
            if (fVar33 <= fVar32) {
              fVar1 = pfVar25[1];
              fVar34 = pfVar12[3];
              if (fVar1 <= fVar34) {
                fVar2 = pfVar25[3];
                fVar35 = pfVar12[1];
                if (fVar35 <= fVar2) {
                  if (fVar32 <= fVar30) {
                    fVar30 = fVar32;
                  }
                  if (fVar33 <= fVar29) {
                    fVar33 = fVar29;
                  }
                  if (fVar2 <= fVar34) {
                    fVar34 = fVar2;
                  }
                  if (fVar35 <= fVar1) {
                    fVar35 = fVar1;
                  }
                  fVar31 = (fVar34 - fVar35) * (fVar30 - fVar33);
                }
              }
            }
          }
          if (fVar28 < fVar31 / (((&(bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->xmin)[local_1bc] -
                                 fVar31) +
                                (&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin)[lVar26])) {
            uVar16 = 0;
          }
        }
        if ((int)uVar16 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back(&picked,&local_1bc);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      for (lVar26 = 0;
          lVar26 < (int)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2); lVar26 = lVar26 + 1)
      {
        iVar20 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar26];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (all_class_bbox_rects.
                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar19,
                   (value_type *)
                   (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)iVar20 * 5));
        std::vector<float,_std::allocator<float>_>::push_back
                  (all_class_bbox_scores.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar19,
                   class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar20);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&picked.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                ((_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores);
      sVar19 = sVar19 + 1;
      lVar24 = lVar24 + local_168 * 4;
    }
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lVar26 = 0x20;
    for (lVar24 = 1;
        pvVar10 = all_class_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar24 < (long)__new_size;
        lVar24 = lVar24 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&bbox_rects,
                 (const_iterator)
                 bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_class_bbox_rects.
                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8),
                 *(BBoxRect **)
                  ((long)&((all_class_bbox_rects.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar26));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&bbox_scores,
                 (const_iterator)
                 bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar10 + lVar26 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar26));
      lVar26 = lVar26 + 0x18;
    }
    qsort_descent_inplace<ncnn::BBoxRect>(&bbox_rects,&bbox_scores);
    uVar11 = (uint)(((long)bbox_rects.
                           super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)bbox_rects.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x14);
    if (this->keep_top_k < (int)uVar11) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                (&bbox_rects,(long)this->keep_top_k);
      std::vector<float,_std::allocator<float>_>::resize(&bbox_scores,(long)this->keep_top_k);
      uVar11 = (uint)(((long)bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
    }
    if (uVar11 == 0) {
      iVar17 = 0;
    }
    else {
      this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_00,6,uVar11,4,opt->blob_allocator);
      pvVar8 = this_00->data;
      iVar17 = -100;
      if ((pvVar8 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
        iVar17 = 0;
        uVar18 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar18 = 0;
        }
        piVar15 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start)->label;
        for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
          lVar24 = (long)(int)uVar21 * (long)this_00->w * this_00->elemsize;
          fVar28 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          *(float *)((long)pvVar8 + lVar24) = (float)*piVar15;
          *(float *)((long)pvVar8 + lVar24 + 4) = fVar28;
          *(float *)((long)pvVar8 + lVar24 + 8) = ((BBoxRect *)(piVar15 + -4))->xmin;
          *(int *)((long)pvVar8 + lVar24 + 0xc) = piVar15[-3];
          *(int *)((long)pvVar8 + lVar24 + 0x10) = piVar15[-2];
          *(int *)((long)pvVar8 + lVar24 + 0x14) = piVar15[-1];
          piVar15 = piVar15 + 5;
        }
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
              (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_class_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&all_class_bbox_rects);
  }
  Mat::~Mat(&bboxes);
  return iVar17;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}